

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void anon_unknown.dwarf_1001c::usageMessage(ostream *stream,char *program_name,bool verbose)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Usage: ",7);
  if (program_name == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar1 = strlen(program_name);
    std::__ostream_insert<char,std::char_traits<char>>(stream,program_name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream," [options] viewname1 infile1 viewname2 infile2 ... outfile",0x3a);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
  std::ostream::put((char)stream);
  std::ostream::flush();
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,
               "\nCombine two or more single-view OpenEXR image files into\na single multi-view image file.  On the command line,\neach single-view input image is specified together with\na corresponding view name.  The first view on the command\nline becomes the default view.  Example:\n\n  exrmultiview left imgL.exr right imgR.exr imgLR.exr\n\nHere, imgL.exr and imgR.exr become the left and right\nviews in output file imgLR.exr.  The left view becomes\nthe default view.\n\nOptions:\n\n  -z x          sets the data compression method to x\n                (none/rle/zip/piz/pxr24/b44/b44a/dwaa/dwab,\n                default is piz)\n\n  -v            verbose mode\n\n  -h, --help    print this message\n\n      --version print version information\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
               ,0x337);
    return;
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [options] viewname1 infile1 viewname2 infile2 ... outfile" << endl;

    if (verbose)
        stream << "\n"
            "Combine two or more single-view OpenEXR image files into\n"
            "a single multi-view image file.  On the command line,\n"
            "each single-view input image is specified together with\n"
            "a corresponding view name.  The first view on the command\n"
            "line becomes the default view.  Example:\n"
            "\n"
            "  exrmultiview left imgL.exr right imgR.exr imgLR.exr\n"
            "\n"
            "Here, imgL.exr and imgR.exr become the left and right\n"
            "views in output file imgLR.exr.  The left view becomes\n"
            "the default view.\n"
            "\n"
            "Options:\n"
            "\n"
            "  -z x          sets the data compression method to x\n"
            "                (none/rle/zip/piz/pxr24/b44/b44a/dwaa/dwab,\n"
            "                default is piz)\n"
            "\n"
            "  -v            verbose mode\n"
            "\n"
            "  -h, --help    print this message\n"
            "\n"
            "      --version print version information\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
}